

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_NewAtomString(JSContext *ctx,char *str)

{
  JSAtom atom;
  size_t len;
  JSValue JVar1;
  
  len = strlen(str);
  atom = JS_NewAtomLen(ctx,str,len);
  if (atom == 0) {
    JVar1 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    JVar1 = __JS_AtomToValue(ctx,atom,1);
    JS_FreeAtom(ctx,atom);
  }
  return JVar1;
}

Assistant:

JSValue JS_NewAtomString(JSContext *ctx, const char *str)
{
    JSAtom atom = JS_NewAtom(ctx, str);
    if (atom == JS_ATOM_NULL)
        return JS_EXCEPTION;
    JSValue val = JS_AtomToString(ctx, atom);
    JS_FreeAtom(ctx, atom);
    return val;
}